

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parasail_aligner.cpp
# Opt level: O3

void process(unsigned_long *count_generated,PairSet *pairs,quad *q,int *SA,uchar *BWT,int *SID,
            vector<int,_std::allocator<int>_> *DB,char *sentinal,int *cutoff)

{
  byte bVar1;
  int iVar2;
  pointer pqVar3;
  pointer pqVar4;
  pointer piVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  pair<int,_int> local_70;
  long local_68;
  int *local_60;
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  *local_58;
  unsigned_long *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  if ((int)cutoff <= q->lcp) {
    pqVar3 = (q->children).super__Vector_base<quad,_std::allocator<quad>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pqVar4 = (q->children).super__Vector_base<quad,_std::allocator<quad>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = q->lb;
    iVar7 = q->rb;
    local_60 = SID;
    local_58 = (_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)pairs;
    local_50 = count_generated;
    if (pqVar3 == pqVar4) {
      lVar11 = (long)iVar8;
      if (iVar8 <= iVar7) {
        do {
          lVar10 = (long)iVar7;
          if (lVar11 < lVar10) {
            bVar1 = BWT[lVar11];
            lVar9 = lVar11;
            local_68 = lVar11;
            do {
              piVar5 = (DB->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if ((bVar1 != BWT[lVar9 + 1]) || ((uint)bVar1 == (int)*sentinal)) {
                iVar8 = SID[SA[lVar11]];
                iVar7 = SID[SA[lVar9 + 1]];
                if (piVar5 == (DB->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish) {
                  if (iVar8 != iVar7) {
                    *local_50 = *local_50 + 1;
                    if (iVar7 <= iVar8) goto LAB_00109eb7;
LAB_00109ed5:
                    local_70.second = iVar7;
                    local_70.first = iVar8;
                    goto LAB_00109ee1;
                  }
                }
                else if ((iVar8 != iVar7) && (piVar5[iVar8] != piVar5[iVar7])) {
                  *local_50 = *local_50 + 1;
                  if (iVar7 < iVar8) goto LAB_00109ed5;
LAB_00109eb7:
                  local_70.second = iVar8;
                  local_70.first = iVar7;
LAB_00109ee1:
                  std::
                  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  ::_M_insert_unique<std::pair<int,int>>(local_58,&local_70);
                  SID = local_60;
                  lVar11 = local_68;
                }
              }
              lVar9 = lVar9 + 1;
              iVar7 = q->rb;
              lVar10 = (long)iVar7;
            } while (lVar9 < lVar10);
          }
          bVar6 = lVar11 < lVar10;
          lVar11 = lVar11 + 1;
        } while (bVar6);
      }
    }
    else if (iVar8 <= iVar7) {
      local_40 = ((long)pqVar3 - (long)pqVar4 >> 3) * -0x3333333333333333;
      local_38 = 0;
      local_48 = (long)iVar8;
      do {
        lVar11 = local_48 + 1;
        if ((local_38 < local_40) &&
           (pqVar3 = (q->children).super__Vector_base<quad,_std::allocator<quad>_>._M_impl.
                     super__Vector_impl_data._M_start, pqVar3[local_38].lb <= local_48)) {
          iVar2 = pqVar3[local_38].rb;
          iVar8 = iVar2 + 1;
          local_38 = local_38 + (iVar2 <= local_48);
        }
        else {
          iVar8 = (int)lVar11;
        }
        if (iVar7 < iVar8) {
          lVar9 = (long)iVar7;
        }
        else {
          bVar1 = BWT[local_48];
          lVar10 = (long)iVar8 + -1;
          local_68 = lVar11;
          do {
            piVar5 = (DB->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((bVar1 != BWT[lVar10 + 1]) || ((uint)bVar1 == (int)*sentinal)) {
              iVar8 = SID[SA[local_48]];
              iVar7 = SID[SA[lVar10 + 1]];
              if (piVar5 == (DB->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish) {
                if (iVar8 != iVar7) {
                  *local_50 = *local_50 + 1;
                  if (iVar7 <= iVar8) goto LAB_00109dd8;
LAB_00109df6:
                  local_70.second = iVar7;
                  local_70.first = iVar8;
                  goto LAB_00109e02;
                }
              }
              else if ((iVar8 != iVar7) && (piVar5[iVar8] != piVar5[iVar7])) {
                *local_50 = *local_50 + 1;
                if (iVar7 < iVar8) goto LAB_00109df6;
LAB_00109dd8:
                local_70.second = iVar8;
                local_70.first = iVar7;
LAB_00109e02:
                std::
                _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                ::_M_insert_unique<std::pair<int,int>>(local_58,&local_70);
                SID = local_60;
                lVar11 = local_68;
              }
            }
            iVar7 = q->rb;
            lVar9 = (long)iVar7;
            lVar10 = lVar10 + 1;
          } while (lVar10 < lVar9);
        }
        bVar6 = local_48 < lVar9;
        local_48 = lVar11;
      } while (bVar6);
    }
  }
  return;
}

Assistant:

inline static void process(
        unsigned long &count_generated,
        PairSet &pairs,
        const quad &q,
        const int * const restrict SA,
        const unsigned char * const restrict BWT,
        const int * const restrict SID,
        const vector<int> &DB,
        const char &sentinal,
        const int &cutoff)
{
    const size_t n_children = q.children.size();
    size_t child_index = 0;

    if (q.lcp < cutoff) return;

    if (n_children) {
        for (int i=q.lb; i<=q.rb; ++i) {
            int j = i+1;
            if (child_index < n_children) {
                if (i >= q.children[child_index].lb) {
                    j = q.children[child_index].rb+1;
                    if (i >= q.children[child_index].rb) {
                        ++child_index;
                    }
                }
            }
            for (/*nope*/; j<=q.rb; ++j) {
                pair_check(count_generated, pairs, i, j, SA, BWT, SID, DB, sentinal);
            }
        }
    }
    else {
        for (int i=q.lb; i<=q.rb; ++i) {
            for (int j=i+1; j<=q.rb; ++j) {
                pair_check(count_generated, pairs, i, j, SA, BWT, SID, DB, sentinal);
            }
        }
    }
}